

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O0

bool __thiscall Clasp::SatElite::backwardSubsume(SatElite *this)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  uint32 uVar6;
  Var VVar7;
  uint32 uVar8;
  int iVar9;
  int iVar10;
  Literal res_00;
  Var VVar11;
  Clause *pCVar12;
  Literal *pLVar13;
  left_type *plVar14;
  size_type sVar15;
  SatElite *siglen;
  uchar *sig;
  uchar *sig_00;
  uchar *sig_01;
  EVP_PKEY_CTX *pEVar16;
  Clause *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  Clause *other;
  uint32 otherId;
  Literal cl;
  uint32 end;
  uint32 i_1;
  uint32 j;
  Literal res;
  ClWList *cls;
  uint32 i;
  Literal best;
  Clause *c;
  undefined4 in_stack_ffffffffffffff18;
  size_type in_stack_ffffffffffffff1c;
  SatElite *in_stack_ffffffffffffff20;
  SatElite *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  Var in_stack_ffffffffffffff34;
  long in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  OccurList *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  Var in_stack_ffffffffffffff54;
  SatElite *in_stack_ffffffffffffff58;
  SatElite *in_stack_ffffffffffffff60;
  bool local_91;
  SatElite *in_stack_ffffffffffffff78;
  Literal in_stack_ffffffffffffffa0;
  Literal in_stack_ffffffffffffffa4;
  Literal in_stack_ffffffffffffffa8;
  Literal in_stack_ffffffffffffffac;
  SatElite *local_48;
  Literal local_3c;
  size_type local_38;
  size_type local_34;
  size_type local_30;
  Literal local_2c;
  SatElite *local_28;
  uint local_20;
  Literal local_1c;
  SatElite *local_18;
  
  bVar3 = propagateFacts(in_stack_ffffffffffffff78);
  if (bVar3) {
LAB_00249a47:
    do {
      sVar5 = *(size_type *)&in_RDI[0xd].field_0x8;
      sVar4 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &in_RDI[0xc].field_0x8);
      if (sVar5 == sVar4) {
LAB_0024a0ab:
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
                  ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)&in_RDI[0xc].field_0x8
                  );
        *(undefined4 *)&in_RDI[0xd].field_0x8 = 0;
        return true;
      }
      if ((*(uint *)&in_RDI[0xd].field_0x8 & 0x1fff) == 0) {
        bVar3 = timeout(in_stack_ffffffffffffff20);
        if (bVar3) goto LAB_0024a0ab;
        sVar5 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &in_RDI[0xc].field_0x8);
        if (1000 < sVar5) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &in_RDI[0xc].field_0x8);
          reportProgress((SatElite *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                         (EventOp)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                         (uint32)in_stack_ffffffffffffff38,in_stack_ffffffffffffff34);
        }
      }
      pCVar12 = peekSubQueue(in_stack_ffffffffffffff20);
      if (pCVar12 == (Clause *)0x0) {
        *(int *)&in_RDI[0xd].field_0x8 = *(int *)&in_RDI[0xd].field_0x8 + 1;
        goto LAB_00249a47;
      }
      local_18 = (SatElite *)popSubQueue(in_stack_ffffffffffffff28);
      pLVar13 = SatPreprocessor::Clause::operator[]((Clause *)local_18,0);
      local_1c.rep_ = pLVar13->rep_;
      for (local_20 = 1; uVar2 = local_20, uVar6 = SatPreprocessor::Clause::size((Clause *)local_18)
          , uVar2 < uVar6; local_20 = local_20 + 1) {
        in_stack_ffffffffffffff78 = *(SatElite **)&in_RDI[5].field_0x8;
        pLVar13 = SatPreprocessor::Clause::operator[]((Clause *)local_18,local_20);
        VVar7 = Literal::var(pLVar13);
        uVar6 = OccurList::numOcc((OccurList *)
                                  (&(in_stack_ffffffffffffff78->super_SatPreprocessor).
                                    _vptr_SatPreprocessor + (ulong)VVar7 * 4));
        lVar1 = *(long *)&in_RDI[5].field_0x8;
        VVar7 = Literal::var(&local_1c);
        uVar8 = OccurList::numOcc((OccurList *)(lVar1 + (ulong)VVar7 * 0x20));
        if (uVar6 < uVar8) {
          pLVar13 = SatPreprocessor::Clause::operator[]((Clause *)local_18,local_20);
          local_1c.rep_ = pLVar13->rep_;
        }
      }
      lVar1 = *(long *)&in_RDI[5].field_0x8;
      VVar7 = Literal::var(&local_1c);
      local_28 = (SatElite *)(lVar1 + (ulong)VVar7 * 0x20);
      local_2c = lit_false();
      local_30 = 0;
      local_34 = 0;
      local_38 = bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::left_size
                           ((left_right_rep<Clasp::Literal,_unsigned_int> *)local_28);
      for (; local_34 != local_38; local_34 = local_34 + 1) {
        plVar14 = bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::left
                            ((left_right_rep<Clasp::Literal,_unsigned_int> *)
                             in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        local_3c.rep_ = plVar14->rep_;
        VVar7 = Literal::var(&local_3c);
        pEVar16 = (EVP_PKEY_CTX *)(ulong)VVar7;
        local_48 = (SatElite *)
                   SatPreprocessor::clause
                             (&in_stack_ffffffffffffff20->super_SatPreprocessor,
                              in_stack_ffffffffffffff1c);
        local_91 = false;
        if ((local_48 != (SatElite *)0x0) && (local_91 = false, local_48 != local_18)) {
          siglen = local_48;
          in_stack_ffffffffffffff58 = local_18;
          in_stack_ffffffffffffff60 = local_48;
          iVar9 = Literal::sign(&local_1c,pEVar16,sig,(size_t *)local_48,in_R8,in_R9);
          iVar10 = Literal::sign(&local_3c,pEVar16,sig_00,(size_t *)siglen,in_R8,in_R9);
          res_00.rep_ = local_1c.rep_;
          if (((byte)iVar9 & 1) == ((byte)iVar10 & 1)) {
            res_00 = lit_true();
          }
          local_2c = subsumes((SatElite *)
                              CONCAT44(in_stack_ffffffffffffffac.rep_,in_stack_ffffffffffffffa8.rep_
                                      ),
                              (Clause *)
                              CONCAT44(in_stack_ffffffffffffffa4.rep_,in_stack_ffffffffffffffa0.rep_
                                      ),in_RDI,res_00);
          in_stack_ffffffffffffffac = lit_false();
          local_91 = Clasp::operator!=((Literal *)in_stack_ffffffffffffff20,
                                       (Literal *)
                                       CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                                      );
        }
        if (local_91 != false) {
          in_stack_ffffffffffffffa8 = lit_true();
          pEVar16 = (EVP_PKEY_CTX *)&stack0xffffffffffffffa8;
          bVar3 = Clasp::operator==((Literal *)in_stack_ffffffffffffff20,
                                    (Literal *)
                                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
          if (bVar3) {
            detach((SatElite *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (uint32)((ulong)in_stack_ffffffffffffff48 >> 0x20));
            local_48 = (SatElite *)0x0;
          }
          else {
            in_stack_ffffffffffffffa4 =
                 Literal::operator~((Literal *)
                                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
            in_stack_ffffffffffffff38 = *(long *)&in_RDI[5].field_0x8;
            local_2c = in_stack_ffffffffffffffa4;
            VVar11 = Literal::var(&local_2c);
            in_stack_ffffffffffffff48 =
                 (OccurList *)(in_stack_ffffffffffffff38 + (long)((ulong)VVar11 * 0x20));
            iVar9 = Literal::sign(&local_2c,pEVar16,sig_01,(size_t *)((ulong)VVar11 * 0x20),in_R8,
                                  in_R9);
            in_stack_ffffffffffffff47 = (undefined1)iVar9;
            in_stack_ffffffffffffff54 = Literal::var(&local_2c);
            Literal::var(&local_1c);
            OccurList::remove(in_stack_ffffffffffffff48,(char *)(ulong)VVar7);
            Literal::var(&local_2c);
            updateHeap(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
            in_stack_ffffffffffffffa0.rep_ = local_2c.rep_;
            bVar3 = strengthenClause(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
                                     (Literal)(uint32)in_stack_ffffffffffffff60);
            if (!bVar3) {
              return false;
            }
            in_stack_ffffffffffffff34 = Literal::var(&local_2c);
            VVar11 = Literal::var(&local_1c);
            if ((in_stack_ffffffffffffff34 == VVar11) ||
               (pCVar12 = SatPreprocessor::clause
                                    (&in_stack_ffffffffffffff20->super_SatPreprocessor,
                                     in_stack_ffffffffffffff1c), in_stack_ffffffffffffff50 = VVar7,
               pCVar12 == (Clause *)0x0)) {
              local_48 = (SatElite *)0x0;
              in_stack_ffffffffffffff50 = VVar7;
            }
          }
        }
        if ((local_48 != (SatElite *)0x0) &&
           (sVar15 = local_30 + 1, bVar3 = local_30 != local_34, local_30 = sVar15, bVar3)) {
          plVar14 = bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::left
                              ((left_right_rep<Clasp::Literal,_unsigned_int> *)
                               in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
          plVar14->rep_ = local_3c.rep_;
        }
      }
      in_stack_ffffffffffffff20 = local_28;
      bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::left_begin
                ((left_right_rep<Clasp::Literal,_unsigned_int> *)0x24a02c);
      bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::shrink_left
                ((left_right_rep<Clasp::Literal,_unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (left_iterator)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff28 = *(SatElite **)&in_RDI[5].field_0x8;
      VVar7 = Literal::var(&local_1c);
      in_stack_ffffffffffffff28->occT_[(ulong)VVar7 * 2 + -7].ebo_.buf =
           (pointer)((ulong)in_stack_ffffffffffffff28->occT_[(ulong)VVar7 * 2 + -7].ebo_.buf &
                    0xffffffff7fffffff);
      bVar3 = propagateFacts(in_stack_ffffffffffffff78);
    } while (bVar3);
  }
  return false;
}

Assistant:

bool SatElite::backwardSubsume() {
	if (!propagateFacts()) return false;
	while (qFront_ != queue_.size()) {
		if ((qFront_ & 8191) == 0) {
			if (timeout()) break;
			if (queue_.size() > 1000) reportProgress(Progress::event_subsumption, qFront_, queue_.size());
		}
		if (peekSubQueue() == 0) { ++qFront_; continue; }
		Clause& c = *popSubQueue();
		// Try to minimize effort by testing against the var in c that occurs least often;
		Literal best = c[0];
		for (uint32 i = 1; i < c.size(); ++i) {
			if (occurs_[c[i].var()].numOcc() < occurs_[best.var()].numOcc()) {
				best  = c[i];
			}
		}
		// Test against all clauses containing best
		ClWList& cls = occurs_[best.var()].refs;
		Literal res  = lit_false();
		uint32  j    = 0;
		// must use index access because cls might change!
		for (uint32 i = 0, end = cls.left_size(); i != end; ++i) {
			Literal cl     = cls.left(i);
			uint32 otherId = cl.var();
			Clause* other  = clause(otherId);
			if (other && other!= &c && (res = subsumes(c, *other, best.sign()==cl.sign()?lit_true():best)) != lit_false()) {
				if (res == lit_true()) {
					// other is subsumed - remove it
					detach(otherId);
					other = 0;
				}
				else {
					// self-subsumption resolution; other is subsumed by c\{res} U {~res}
					// remove ~res from other, add it to subQ so that we can check if it now subsumes c
					res = ~res;
					occurs_[res.var()].remove(otherId, res.sign(), res.var() != best.var());
					updateHeap(res.var());
					if (!strengthenClause(otherId, res))              { return false; }
					if (res.var() == best.var() || !clause(otherId))  { other = 0; }
				}
			}
			if (other && j++ != i)  { cls.left(j-1) = cl; }
		}
		cls.shrink_left(cls.left_begin()+j);
		occurs_[best.var()].dirty = 0;
		assert(occurs_[best.var()].numOcc() == (uint32)cls.left_size());
		if (!propagateFacts()) return false;
	}
	queue_.clear();
	qFront_ = 0;
	return true;
}